

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

ggml_tallocr * ggml_tallocr_new(ggml_backend_buffer_t buffer)

{
  _func_void_ptr_ggml_backend_buffer_t *buffer_00;
  _func_ggml_status_ggml_backend_buffer_t_ggml_tensor_ptr *alignment;
  _func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *p_Var1;
  _func_void_ggml_backend_buffer_t *in_RSI;
  ggml_backend_buffer_t in_RDI;
  size_t align;
  void *base;
  ggml_backend_buffer_t pgVar2;
  
  pgVar2 = in_RDI;
  buffer_00 = (_func_void_ptr_ggml_backend_buffer_t *)ggml_backend_buffer_get_base(in_RDI);
  alignment = (_func_ggml_status_ggml_backend_buffer_t_ggml_tensor_ptr *)
              ggml_backend_buffer_get_alignment((ggml_backend_buffer_t)0x15ac0b);
  (pgVar2->iface).free_buffer = in_RSI;
  (pgVar2->iface).get_base = buffer_00;
  (pgVar2->iface).init_tensor = alignment;
  p_Var1 = (_func_void_ggml_backend_buffer_t_ggml_tensor_ptr_uint8_t_size_t_size_t *)
           aligned_offset(buffer_00,0,(size_t)alignment);
  (pgVar2->iface).memset_tensor = p_Var1;
  return (ggml_tallocr *)in_RDI;
}

Assistant:

struct ggml_tallocr ggml_tallocr_new(ggml_backend_buffer_t buffer) {
    void * base = ggml_backend_buffer_get_base(buffer);
    size_t align = ggml_backend_buffer_get_alignment(buffer);

    assert(align && !(align & (align - 1))); // power of 2

    struct ggml_tallocr talloc = (struct ggml_tallocr) {
        /*.buffer    = */ buffer,
        /*.base      = */ base,
        /*.alignment = */ align,
        /*.offset    = */ aligned_offset(base, 0, align),
    };
    return talloc;
}